

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_scale(uint16_t *out,uint16_t *in,uint16_t scale,uint p,uint q)

{
  short sVar1;
  short sVar2;
  ulong uVar3;
  short sVar4;
  
  sVar2 = (short)q;
  if (p != 0) {
    uVar3 = 0;
    do {
      sVar4 = (short)((uint)in[uVar3] * (uint)scale) -
              (short)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0
                            ) * (ulong)((uint)in[uVar3] * (uint)scale) >> 0x30) * sVar2;
      sVar1 = sVar2;
      if ((short)(sVar4 - sVar2) < 0) {
        sVar1 = 0;
      }
      out[uVar3] = sVar4 - sVar1;
      uVar3 = uVar3 + 1;
    } while (p != uVar3);
  }
  return;
}

Assistant:

void ntru_scale(uint16_t *out, const uint16_t *in, uint16_t scale,
               unsigned p, unsigned q)
{
    SETUP;
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] * scale);
}